

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall clipp::parsing_result::any_error(parsing_result *this)

{
  bool bVar1;
  size_type sVar2;
  parsing_result *in_RDI;
  parsing_result *unaff_retaddr;
  undefined1 local_9;
  
  sVar2 = unmapped_args_count(this);
  local_9 = true;
  if (sVar2 == 0) {
    missing(in_RDI);
    bVar1 = std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
            ::empty((vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
                     *)unaff_retaddr);
    local_9 = true;
    if (bVar1) {
      bVar1 = any_blocked(unaff_retaddr);
      local_9 = true;
      if (!bVar1) {
        bVar1 = any_conflict(unaff_retaddr);
        local_9 = true;
        if (!bVar1) {
          local_9 = any_bad_repeat(unaff_retaddr);
        }
      }
    }
  }
  return local_9;
}

Assistant:

bool any_error() const noexcept {
        return unmapped_args_count() > 0 || !missing().empty() ||
               any_blocked() || any_conflict() || any_bad_repeat();
    }